

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteSInt64
               (int field_number,int64 value,CodedOutputStream *output)

{
  uint64 in_RDX;
  CodedOutputStream *in_RSI;
  int in_EDI;
  CodedOutputStream *in_stack_ffffffffffffffc0;
  uint64 value_00;
  
  value_00 = in_RDX;
  MakeTag(in_EDI,WIRETYPE_VARINT);
  io::CodedOutputStream::WriteTag(in_stack_ffffffffffffffc0,(uint32)(in_RDX >> 0x20));
  ZigZagEncode64((int64)in_RSI);
  io::CodedOutputStream::WriteVarint64(in_RSI,value_00);
  return;
}

Assistant:

void WireFormatLite::WriteSInt64(int field_number, int64 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteSInt64NoTag(value, output);
}